

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_truetype.h
# Opt level: O2

int stbtt_PackFontRangesRenderIntoRects
              (stbtt_pack_context *spc,stbtt_fontinfo *info,stbtt_pack_range *ranges,int num_ranges,
              stbrp_rect *rects)

{
  float height;
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  stbtt_packedchar *psVar8;
  undefined4 uVar9;
  short sVar10;
  short sVar11;
  undefined1 auVar12 [15];
  undefined1 auVar13 [14];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  undefined1 auVar17 [15];
  undefined1 auVar18 [14];
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  unkuint9 Var22;
  undefined1 auVar23 [11];
  undefined1 auVar24 [13];
  undefined1 auVar25 [14];
  unkbyte10 Var26;
  undefined1 auVar27 [12];
  undefined1 auVar28 [15];
  undefined1 auVar29 [15];
  uint6 uVar30;
  int glyph_index;
  ulong uVar31;
  long lVar32;
  stbtt_pack_range *psVar33;
  int iVar34;
  long lVar35;
  stbrp_rect *psVar36;
  ushort uVar37;
  char cVar39;
  char cVar40;
  undefined4 extraout_XMM0_Db;
  short sVar41;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  undefined1 auVar38 [16];
  short sVar43;
  undefined1 auVar42 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  int local_e4;
  int y0;
  int x0;
  int advance;
  float local_c8;
  undefined4 uStack_c4;
  undefined4 uStack_c0;
  undefined4 uStack_bc;
  stbtt_pack_range *local_b0;
  stbrp_rect *local_a8;
  ulong local_a0;
  long local_98;
  ulong local_90;
  stbtt_pack_range *local_88;
  long local_80;
  int y1;
  int x1;
  int lsb;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  local_68._0_4_ = spc->h_oversample;
  local_68._4_4_ = spc->v_oversample;
  uStack_60 = 0;
  uVar31 = 0;
  local_a0 = (ulong)(uint)num_ranges;
  if (num_ranges < 1) {
    local_a0 = uVar31;
  }
  local_e4 = 1;
  lVar32 = 0;
  local_b0 = ranges;
  local_a8 = rects;
  while (psVar33 = local_b0, uVar31 != local_a0) {
    height = local_b0[uVar31].font_size;
    local_90 = uVar31;
    if (height <= 0.0) {
      uStack_c4 = 0x80000000;
      uStack_c0 = 0x80000000;
      uStack_bc = 0x80000000;
      local_c8 = -height / (float)(ushort)(*(ushort *)(info->data + (long)info->head + 0x12) << 8 |
                                          *(ushort *)(info->data + (long)info->head + 0x12) >> 8);
    }
    else {
      local_c8 = stbtt_ScaleForPixelHeight(info,height);
      uStack_c4 = extraout_XMM0_Db;
      uStack_c0 = extraout_XMM0_Dc;
      uStack_bc = extraout_XMM0_Dd;
    }
    psVar33 = psVar33 + uVar31;
    uVar31._0_1_ = psVar33->h_oversample;
    uVar31._1_1_ = psVar33->v_oversample;
    uVar31._2_6_ = *(undefined6 *)&psVar33->field_0x22;
    auVar12._8_6_ = 0;
    auVar12._0_8_ = uVar31;
    auVar12[0xe] = (char)((uint6)uVar31._2_6_ >> 0x28);
    auVar14._8_4_ = 0;
    auVar14._0_8_ = uVar31;
    auVar14[0xc] = (char)((uint6)uVar31._2_6_ >> 0x20);
    auVar14._13_2_ = auVar12._13_2_;
    auVar15._8_4_ = 0;
    auVar15._0_8_ = uVar31;
    auVar15._12_3_ = auVar14._12_3_;
    auVar16._8_2_ = 0;
    auVar16._0_8_ = uVar31;
    auVar16[10] = (char)((uint6)uVar31._2_6_ >> 0x18);
    auVar16._11_4_ = auVar15._11_4_;
    auVar17._8_2_ = 0;
    auVar17._0_8_ = uVar31;
    auVar17._10_5_ = auVar16._10_5_;
    auVar19[8] = (char)((uint6)uVar31._2_6_ >> 0x10);
    auVar19._0_8_ = uVar31;
    auVar19._9_6_ = auVar17._9_6_;
    auVar21._7_8_ = 0;
    auVar21._0_7_ = auVar19._8_7_;
    cVar40 = (char)((uint6)uVar31._2_6_ >> 8);
    Var22 = CONCAT81(SUB158(auVar21 << 0x40,7),cVar40);
    auVar28._9_6_ = 0;
    auVar28._0_9_ = Var22;
    cVar39 = (char)uVar31._2_6_;
    auVar23._1_10_ = SUB1510(auVar28 << 0x30,5);
    auVar23[0] = cVar39;
    auVar29._11_4_ = 0;
    auVar29._0_11_ = auVar23;
    auVar24._1_12_ = SUB1512(auVar29 << 0x20,3);
    auVar24[0] = uVar31._1_1_;
    uVar37 = CONCAT11(0,(undefined1)uVar31);
    auVar20._2_13_ = auVar24;
    auVar20._0_2_ = uVar37;
    sVar43 = 1 - auVar24._0_2_;
    sVar10 = -auVar23._0_2_;
    sVar41 = (short)Var22;
    sVar11 = -sVar41;
    auVar13._10_2_ = 0;
    auVar13._0_10_ = auVar20._0_10_;
    auVar13._12_2_ = sVar41;
    uVar30 = CONCAT42(auVar13._10_4_,auVar23._0_2_);
    auVar25._6_8_ = 0;
    auVar25._0_6_ = uVar30;
    Var26 = CONCAT82(SUB148(auVar25 << 0x40,6),auVar24._0_2_);
    auVar18._4_10_ = Var26;
    auVar18._0_4_ = CONCAT22(0,uVar37);
    spc->h_oversample = (int)auVar18._0_8_;
    spc->v_oversample = (int)((ulong)auVar18._0_8_ >> 0x20);
    auVar45._0_4_ = (float)CONCAT22(0,uVar37);
    auVar45._4_4_ = (float)(int)Var26;
    auVar45._8_4_ = (float)(int)uVar30;
    auVar45._12_4_ = (float)(auVar13._10_4_ >> 0x10);
    local_58 = divps(_DAT_0016e160,auVar45);
    auVar46[0] = -((undefined1)uVar31 == 0);
    auVar46[1] = -((undefined1)uVar31 == 0);
    auVar46[2] = -((undefined1)uVar31 == 0);
    auVar46[3] = -((undefined1)uVar31 == 0);
    auVar46[4] = -(uVar31._1_1_ == '\0');
    auVar46[5] = -(uVar31._1_1_ == '\0');
    auVar46[6] = -(uVar31._1_1_ == '\0');
    auVar46[7] = -(uVar31._1_1_ == '\0');
    auVar46[8] = -(cVar39 == '\0');
    auVar46[9] = -(cVar39 == '\0');
    auVar46[10] = -(cVar39 == '\0');
    auVar46[0xb] = -(cVar39 == '\0');
    auVar46[0xc] = -(cVar40 == '\0');
    auVar46[0xd] = -(cVar40 == '\0');
    auVar46[0xe] = -(cVar40 == '\0');
    auVar46[0xf] = -(cVar40 == '\0');
    Var26 = CONCAT64(CONCAT42(CONCAT22(sVar11,sVar11),sVar10),CONCAT22(sVar10,sVar11));
    auVar27._4_8_ = (long)((unkuint10)Var26 >> 0x10);
    auVar27._2_2_ = sVar43;
    auVar27._0_2_ = sVar43;
    auVar42._0_4_ = (float)(int)(short)(1 - uVar37);
    auVar42._4_4_ = (float)(auVar27._0_4_ >> 0x10);
    auVar42._8_4_ = (float)((int)((unkuint10)Var26 >> 0x10) >> 0x10);
    auVar42._12_4_ = (float)(int)sVar11;
    auVar38._0_4_ = auVar45._0_4_ + auVar45._0_4_;
    auVar38._4_4_ = auVar45._4_4_ + auVar45._4_4_;
    auVar38._8_4_ = auVar45._8_4_ + auVar45._8_4_;
    auVar38._12_4_ = auVar45._12_4_ + auVar45._12_4_;
    local_48 = divps(auVar42,auVar38);
    local_48 = ~auVar46 & local_48;
    local_98 = (long)(int)lVar32;
    psVar36 = local_a8 + local_98;
    lVar35 = 0;
    local_88 = psVar33;
    for (lVar32 = 0; lVar32 < psVar33->num_chars; lVar32 = lVar32 + 1) {
      if (psVar36->was_packed == 0) {
        local_e4 = 0;
      }
      else {
        if (psVar33->array_of_unicode_codepoints == (int *)0x0) {
          iVar34 = psVar33->first_unicode_codepoint_in_range + (int)lVar32;
        }
        else {
          iVar34 = psVar33->array_of_unicode_codepoints[lVar32];
        }
        psVar8 = psVar33->chardata_for_range;
        local_80 = lVar32;
        glyph_index = stbtt_FindGlyphIndex(info,iVar34);
        uVar1 = psVar36->x;
        uVar4 = psVar36->y;
        iVar34 = spc->padding;
        psVar36->x = uVar1 + iVar34;
        psVar36->y = uVar4 + iVar34;
        uVar2 = psVar36->w;
        uVar5 = psVar36->h;
        psVar36->w = uVar2 - iVar34;
        psVar36->h = uVar5 - iVar34;
        stbtt_GetGlyphHMetrics(info,glyph_index,&advance,&lsb);
        stbtt_GetGlyphBitmapBox
                  (info,glyph_index,(float)spc->h_oversample * local_c8,
                   (float)spc->v_oversample * local_c8,&x0,&y0,&x1,&y1);
        stbtt_MakeGlyphBitmapSubpixel
                  (info,spc->pixels +
                        (long)psVar36->y * (long)spc->stride_in_bytes + (long)psVar36->x,
                   (psVar36->w - spc->h_oversample) + 1,(psVar36->h - spc->v_oversample) + 1,
                   spc->stride_in_bytes,(float)spc->h_oversample * local_c8,
                   (float)spc->v_oversample * local_c8,0.0,0.0,glyph_index);
        if (1 < spc->h_oversample) {
          stbtt__h_prefilter(spc->pixels +
                             (long)psVar36->y * (long)spc->stride_in_bytes + (long)psVar36->x,
                             psVar36->w,psVar36->h,spc->stride_in_bytes,spc->h_oversample);
        }
        if (1 < spc->v_oversample) {
          stbtt__v_prefilter(spc->pixels +
                             (long)psVar36->y * (long)spc->stride_in_bytes + (long)psVar36->x,
                             psVar36->w,psVar36->h,spc->stride_in_bytes,spc->v_oversample);
        }
        *(float *)((long)&psVar8->xadvance + lVar35) = (float)advance * local_c8;
        *(ulong *)((long)&psVar8->xoff + lVar35) =
             CONCAT44((float)y0 * local_58._4_4_ + local_48._4_4_,
                      (float)x0 * local_58._0_4_ + local_48._0_4_);
        uVar3 = psVar36->w;
        uVar6 = psVar36->h;
        uVar7 = psVar36->x;
        uVar9 = psVar36->y;
        *(short *)((long)&psVar8->x0 + lVar35) = (short)uVar7;
        *(short *)((long)&psVar8->y0 + lVar35) = (short)uVar9;
        auVar44._0_4_ = uVar7 + uVar3;
        auVar44._4_4_ = uVar9 + uVar6;
        auVar44._8_8_ = 0;
        auVar45 = pshuflw(auVar44,auVar44,0xe8);
        *(int *)((long)&psVar8->x1 + lVar35) = auVar45._0_4_;
        *(ulong *)((long)&psVar8->xoff2 + lVar35) =
             CONCAT44((float)(y0 + uVar6) * local_58._4_4_ + local_48._4_4_,
                      (float)(x0 + uVar3) * local_58._0_4_ + local_48._0_4_);
        lVar32 = local_80;
        psVar33 = local_88;
      }
      lVar35 = lVar35 + 0x1c;
      psVar36 = psVar36 + 1;
    }
    lVar32 = local_98 + lVar32;
    uVar31 = local_90 + 1;
  }
  spc->h_oversample = (undefined4)local_68;
  spc->v_oversample = local_68._4_4_;
  return local_e4;
}

Assistant:

STBTT_DEF int stbtt_PackFontRangesRenderIntoRects(stbtt_pack_context *spc, const stbtt_fontinfo *info, stbtt_pack_range *ranges, int num_ranges, stbrp_rect *rects)
{
   int i,j,k, return_value = 1;

   // save current values
   int old_h_over = spc->h_oversample;
   int old_v_over = spc->v_oversample;

   k = 0;
   for (i=0; i < num_ranges; ++i) {
      float fh = ranges[i].font_size;
      float scale = fh > 0 ? stbtt_ScaleForPixelHeight(info, fh) : stbtt_ScaleForMappingEmToPixels(info, -fh);
      float recip_h,recip_v,sub_x,sub_y;
      spc->h_oversample = ranges[i].h_oversample;
      spc->v_oversample = ranges[i].v_oversample;
      recip_h = 1.0f / spc->h_oversample;
      recip_v = 1.0f / spc->v_oversample;
      sub_x = stbtt__oversample_shift(spc->h_oversample);
      sub_y = stbtt__oversample_shift(spc->v_oversample);
      for (j=0; j < ranges[i].num_chars; ++j) {
         stbrp_rect *r = &rects[k];
         if (r->was_packed) {
            stbtt_packedchar *bc = &ranges[i].chardata_for_range[j];
            int advance, lsb, x0,y0,x1,y1;
            int codepoint = ranges[i].array_of_unicode_codepoints == NULL ? ranges[i].first_unicode_codepoint_in_range + j : ranges[i].array_of_unicode_codepoints[j];
            int glyph = stbtt_FindGlyphIndex(info, codepoint);
            stbrp_coord pad = (stbrp_coord) spc->padding;

            // pad on left and top
            r->x += pad;
            r->y += pad;
            r->w -= pad;
            r->h -= pad;
            stbtt_GetGlyphHMetrics(info, glyph, &advance, &lsb);
            stbtt_GetGlyphBitmapBox(info, glyph,
                                    scale * spc->h_oversample,
                                    scale * spc->v_oversample,
                                    &x0,&y0,&x1,&y1);
            stbtt_MakeGlyphBitmapSubpixel(info,
                                          spc->pixels + r->x + r->y*spc->stride_in_bytes,
                                          r->w - spc->h_oversample+1,
                                          r->h - spc->v_oversample+1,
                                          spc->stride_in_bytes,
                                          scale * spc->h_oversample,
                                          scale * spc->v_oversample,
                                          0,0,
                                          glyph);

            if (spc->h_oversample > 1)
               stbtt__h_prefilter(spc->pixels + r->x + r->y*spc->stride_in_bytes,
                                  r->w, r->h, spc->stride_in_bytes,
                                  spc->h_oversample);

            if (spc->v_oversample > 1)
               stbtt__v_prefilter(spc->pixels + r->x + r->y*spc->stride_in_bytes,
                                  r->w, r->h, spc->stride_in_bytes,
                                  spc->v_oversample);

            bc->x0       = (stbtt_int16)  r->x;
            bc->y0       = (stbtt_int16)  r->y;
            bc->x1       = (stbtt_int16) (r->x + r->w);
            bc->y1       = (stbtt_int16) (r->y + r->h);
            bc->xadvance =                scale * advance;
            bc->xoff     =       (float)  x0 * recip_h + sub_x;
            bc->yoff     =       (float)  y0 * recip_v + sub_y;
            bc->xoff2    =                (x0 + r->w) * recip_h + sub_x;
            bc->yoff2    =                (y0 + r->h) * recip_v + sub_y;
         } else {
            return_value = 0; // if any fail, report failure
         }

         ++k;
      }
   }

   // restore original values
   spc->h_oversample = old_h_over;
   spc->v_oversample = old_v_over;

   return return_value;
}